

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_hash.c
# Opt level: O0

void MultAddPrime89(uint64_t *r,uint64_t x,uint64_t *a,uint64_t *b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t carry;
  uint64_t s1;
  uint64_t s0;
  uint64_t d3;
  uint64_t d2;
  uint64_t d1;
  uint64_t d0;
  uint64_t c00;
  uint64_t c01;
  uint64_t c10;
  uint64_t c11;
  uint64_t c20;
  uint64_t c21;
  uint64_t x0;
  uint64_t x1;
  uint64_t *b_local;
  uint64_t *a_local;
  uint64_t x_local;
  uint64_t *r_local;
  
  uVar5 = x >> 0x20;
  uVar6 = x & 0xffffffff;
  uVar1 = a[2];
  uVar2 = a[1];
  uVar3 = a[2];
  uVar4 = *a;
  uVar7 = (uVar3 * uVar6 >> 0x19) + (uVar2 * uVar5 >> 0x19) + (a[1] * uVar6 >> 0x39) +
          (*a * uVar5 >> 0x39);
  uVar8 = uVar1 * uVar5 * 0x80;
  uVar9 = (a[1] * uVar6 & 0x1ffffffffffffff) + (*a * uVar5 & 0x1ffffffffffffff);
  uVar10 = *b + (uVar4 * uVar6 & 0xffffffff) + (uVar7 & 0xffffffff) + (uVar8 & 0xffffffff);
  *r = uVar10 & 0xffffffff;
  uVar7 = b[1] + (uVar4 * uVar6 >> 0x20) + (uVar7 >> 0x20) + (uVar8 >> 0x20) + (uVar9 & 0xffffffff)
          + (uVar10 >> 0x20);
  r[1] = uVar7 & 0xffffffff;
  r[2] = b[2] + (uVar9 >> 0x20) +
         (uVar3 * uVar6 & 0x1ffffff) + (uVar2 * uVar5 & 0x1ffffff) + (uVar1 * uVar5 >> 0x39) +
         (uVar7 >> 0x20);
  return;
}

Assistant:

static void
MultAddPrime89(INT96 r, uint64_t x, const INT96 a, const INT96 b)
{
#define LOW(x) ((x)&0xFFFFFFFF)
#define HIGH(x) ((x)>>32)
    uint64_t x1, x0, c21, c20, c11, c10, c01, c00;
    uint64_t d0, d1, d2, d3;
    uint64_t s0, s1, carry;
    x1 = HIGH(x);
    x0 = LOW(x);
    c21 = a[2]*x1;
    c11 = a[1]*x1;
    c01 = a[0]*x1;
    c20 = a[2]*x0;
    c10 = a[1]*x0;
    c00 = a[0]*x0;
    d0 = (c20>>25)+(c11>>25)+(c10>>57)+(c01>>57);
    d1 = (c21<<7);
    d2 = (c10&Prime89_21) + (c01&Prime89_21);
    d3 = (c20&Prime89_2) + (c11&Prime89_2) + (c21>>57);
    s0 = b[0] + LOW(c00) + LOW(d0) + LOW(d1);
    r[0] = LOW(s0);
    carry = HIGH(s0);
    s1 = b[1] + HIGH(c00) + HIGH(d0) + HIGH(d1) + LOW(d2) + carry;
    r[1] = LOW(s1);
    carry = HIGH(s1);
    r[2] = b[2] + HIGH(d2) + d3 + carry;
#undef LOW
#undef HIGH
}